

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O0

void pmpaddr_csr_write_riscv64(CPURISCVState_conflict2 *env,uint32_t addr_index,target_ulong val)

{
  int iVar1;
  target_ulong val_local;
  uint32_t addr_index_local;
  CPURISCVState_conflict2 *env_local;
  
  if ((addr_index < 0x10) && (iVar1 = pmp_is_locked(env,addr_index), iVar1 == 0)) {
    (env->pmp_state).pmp[addr_index].addr_reg = val;
    pmp_update_rule(env,addr_index);
  }
  return;
}

Assistant:

void pmpaddr_csr_write(CPURISCVState *env, uint32_t addr_index,
    target_ulong val)
{
    if (addr_index < MAX_RISCV_PMPS) {
        if (!pmp_is_locked(env, addr_index)) {
            env->pmp_state.pmp[addr_index].addr_reg = val;
            pmp_update_rule(env, addr_index);
        } else {
            qemu_log_mask(LOG_GUEST_ERROR,
                          "ignoring pmpaddr write - locked\n");
        }
    } else {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "ignoring pmpaddr write - out of bounds\n");
    }
}